

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O2

void __thiscall
markdown::token::HtmlAnchorTag::HtmlAnchorTag(HtmlAnchorTag *this,string *url,string *title)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  anon_unknown_0::encodeString(&local_38,url,9);
  std::operator+(&local_b8,"<a href=\"",&local_38);
  std::operator+(&local_98,&local_b8,"\"");
  sVar1 = title->_M_string_length;
  if (sVar1 == 0) {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
  }
  else {
    anon_unknown_0::encodeString(&local_f8,title,9);
    std::operator+(&local_d8," title=\"",&local_f8);
    std::operator+(&local_118,&local_d8,"\"");
  }
  std::operator+(&local_78,&local_98,&local_118);
  std::operator+(&local_58,&local_78,">");
  TextHolder::TextHolder(&this->super_TextHolder,&local_58,false,0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_118);
  if (sVar1 != 0) {
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_TextHolder).super_Token._vptr_Token = (_func_int **)&PTR__TextHolder_00171930;
  return;
}

Assistant:

HtmlAnchorTag::HtmlAnchorTag(const std::string& url, const std::string& title):
	TextHolder("<a href=\""+encodeString(url, cQuotes|cAmps)+"\""
		+(title.empty() ? std::string() : " title=\""+encodeString(title, cQuotes|cAmps)+"\"")
		+">", false, 0)
{
	// This space deliberately blank. ;-)
}